

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_row.cc
# Opt level: O2

void __thiscall
transition_row_append_Test::~transition_row_append_Test(transition_row_append_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(transition_row, append) {
    auto row1 = make_row(t1());
    static_assert(decltype(row1)::size == 1, "");

    EXPECT_TRUE(std::get<0>(row1.data()).guard(e1{1}));
    EXPECT_FALSE(std::get<0>(row1.data()).guard(e1{0}));

    auto row2 = std::move(row1).append(t2());
    static_assert(decltype(row2)::size == 2, "");

    EXPECT_TRUE(std::get<0>(row2.data()).guard(e1{1}));
    EXPECT_FALSE(std::get<0>(row2.data()).guard(e1{0}));

    EXPECT_FALSE(std::get<1>(row2.data()).guard(e1{1}));
    EXPECT_TRUE(std::get<1>(row2.data()).guard(e1{0}));
}